

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O2

__m128i * qP_word(int8_t *read_num,int8_t *mat,int32_t readLen,int32_t n)

{
  int iVar1;
  __m128i *palVar2;
  short sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  __m128i *palVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar8 = (long)(readLen + 7) / 8;
  iVar1 = (int)uVar8;
  palVar2 = (__m128i *)malloc((long)(iVar1 * n) << 4);
  iVar4 = 0;
  uVar5 = 0;
  if (0 < iVar1) {
    uVar5 = uVar8 & 0xffffffff;
  }
  palVar7 = palVar2;
  iVar6 = 0;
  if (0 < n) {
    iVar6 = n;
  }
  for (; iVar4 != iVar6; iVar4 = iVar4 + 1) {
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      uVar10 = uVar8;
      for (lVar9 = 0; (int)lVar9 != 0x10; lVar9 = lVar9 + 2) {
        if ((long)uVar10 < (long)readLen) {
          sVar3 = (short)mat[(long)read_num[uVar10] + (long)(iVar4 * n)];
        }
        else {
          sVar3 = 0;
        }
        *(short *)((long)*palVar7 + lVar9) = sVar3;
        uVar10 = uVar10 + (long)iVar1;
      }
      palVar7 = (__m128i *)((long)*palVar7 + lVar9);
    }
  }
  return palVar2;
}

Assistant:

static __m128i* qP_word (const int8_t* read_num,
				  const int8_t* mat,
				  const int32_t readLen,
				  const int32_t n) {

	int32_t segLen = (readLen + 7) / 8;
	__m128i* vProfile = (__m128i*)malloc(n * segLen * sizeof(__m128i));
	int16_t* t = (int16_t*)vProfile;
	int32_t nt, i, j;
	int32_t segNum;

	/* Generate query profile rearrange query sequence & calculate the weight of match/mismatch */
	for (nt = 0; LIKELY(nt < n); nt ++) {
		for (i = 0; i < segLen; i ++) {
			j = i;
			for (segNum = 0; LIKELY(segNum < 8) ; segNum ++) {
				*t++ = j>= readLen ? 0 : mat[nt * n + read_num[j]];
				j += segLen;
			}
		}
	}
	return vProfile;
}